

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

size_t mz_zip_heap_write_func(void *pOpaque,mz_uint64 file_ofs,void *pBuf,size_t n)

{
  long lVar1;
  long lVar2;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  size_t new_capacity;
  void *pNew_block;
  mz_uint64 new_size;
  mz_zip_internal_state *pState;
  mz_zip_archive *pZip;
  size_t n_local;
  void *pBuf_local;
  mz_uint64 file_ofs_local;
  void *pOpaque_local;
  
  lVar1 = *(long *)((long)pOpaque + 0x68);
  if (*(ulong *)(lVar1 + 0x88) < file_ofs + n) {
    local_70 = file_ofs + n;
  }
  else {
    local_70 = *(ulong *)(lVar1 + 0x88);
  }
  if (n == 0) {
    pOpaque_local = (void *)0x0;
  }
  else {
    if (*(ulong *)(lVar1 + 0x90) < local_70) {
      if (*(ulong *)(lVar1 + 0x90) < 0x40) {
        local_78 = 0x40;
      }
      else {
        local_78 = *(ulong *)(lVar1 + 0x90);
      }
      for (local_68 = local_78; local_68 < local_70; local_68 = local_68 << 1) {
      }
      lVar2 = (**(code **)((long)pOpaque + 0x38))
                        (*(undefined8 *)((long)pOpaque + 0x40),*(undefined8 *)(lVar1 + 0x80),1,
                         local_68);
      if (lVar2 == 0) {
        if (pOpaque != (void *)0x0) {
          *(undefined4 *)((long)pOpaque + 0x1c) = 0x10;
        }
        return 0;
      }
      *(long *)(lVar1 + 0x80) = lVar2;
      *(ulong *)(lVar1 + 0x90) = local_68;
    }
    memcpy((void *)(*(long *)(lVar1 + 0x80) + file_ofs),pBuf,n);
    *(ulong *)(lVar1 + 0x88) = local_70;
    pOpaque_local = (void *)n;
  }
  return (size_t)pOpaque_local;
}

Assistant:

static size_t mz_zip_heap_write_func(void *pOpaque, mz_uint64 file_ofs,
                                     const void *pBuf, size_t n) {
  mz_zip_archive *pZip = (mz_zip_archive *)pOpaque;
  mz_zip_internal_state *pState = pZip->m_pState;
  mz_uint64 new_size = MZ_MAX(file_ofs + n, pState->m_mem_size);

  if (!n)
    return 0;

  /* An allocation this big is likely to just fail on 32-bit systems, so don't
   * even go there. */
  if ((sizeof(size_t) == sizeof(mz_uint32)) && (new_size > 0x7FFFFFFF)) {
    mz_zip_set_error(pZip, MZ_ZIP_FILE_TOO_LARGE);
    return 0;
  }

  if (new_size > pState->m_mem_capacity) {
    void *pNew_block;
    size_t new_capacity = MZ_MAX(64, pState->m_mem_capacity);

    while (new_capacity < new_size)
      new_capacity *= 2;

    if (NULL == (pNew_block = pZip->m_pRealloc(
                     pZip->m_pAlloc_opaque, pState->m_pMem, 1, new_capacity))) {
      mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
      return 0;
    }

    pState->m_pMem = pNew_block;
    pState->m_mem_capacity = new_capacity;
  }
  memcpy((mz_uint8 *)pState->m_pMem + file_ofs, pBuf, n);
  pState->m_mem_size = (size_t)new_size;
  return n;
}